

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O1

void __thiscall sjtu::OrderManager::~OrderManager(OrderManager *this)

{
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[2])();
  *(int *)(CONCAT44(extraout_var,iVar1) + 0xa0) = this->pending_id;
  (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
    _vptr_FileManager_Base[3])();
  this_00 = this->PendingBpTree;
  if (this_00 !=
      (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
       *)0x0) {
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::~BplusTree(this_00);
    operator_delete(this_00,0x18);
  }
  if (this->OrderFile != (FileManager<std::pair<sjtu::orderType,_long>_> *)0x0) {
    (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
      _vptr_FileManager_Base[5])();
  }
  return;
}

Assistant:

~OrderManager() {
            auto tmp = OrderFile->read(0);
            tmp -> first.num = pending_id;
            OrderFile-> save(0);
            delete PendingBpTree;
            delete OrderFile;
        }